

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2cirs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  CEDate *this;
  CESkyCoord cirs_coord;
  CESkyCoord gal_coord;
  CEDate date;
  CEExecOptions opts;
  CEExecOptions *in_stack_fffffffffffffb70;
  CLOptions *in_stack_fffffffffffffb78;
  CLOptions *this_00;
  undefined8 in_stack_fffffffffffffb80;
  CEDateType date_format;
  double in_stack_fffffffffffffb88;
  allocator *coord_type;
  CEObserver *observer;
  CEObserver *this_01;
  undefined7 in_stack_fffffffffffffba8;
  allocator<char> local_369;
  string local_368 [32];
  CEExecOptions *local_348;
  allocator local_329;
  string local_328 [32];
  double local_308;
  CESkyCoord *in_stack_fffffffffffffd18;
  CEExecOptions *in_stack_fffffffffffffd20;
  undefined1 local_2b9 [113];
  CEObserver local_248;
  char **in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe74;
  undefined8 in_stack_fffffffffffffe78;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  this_01 = &local_248;
  DefineOpts();
  uVar1 = CLOptions::ParseCommandLine
                    ((CLOptions *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                     in_stack_fffffffffffffe68);
  if ((bool)uVar1) {
    local_2b9._97_4_ = 1;
  }
  else {
    observer = (CEObserver *)local_2b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_2b9 + 1),"juliandate",(allocator *)observer);
    this = (CEDate *)
           CLOptions::AsDouble(in_stack_fffffffffffffb78,(string *)in_stack_fffffffffffffb70);
    CEDate::CEDate(this,in_stack_fffffffffffffb88,date_format);
    std::__cxx11::string::~string((string *)(local_2b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2b9);
    coord_type = &local_329;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"glon",coord_type);
    local_308 = CLOptions::AsDouble(in_stack_fffffffffffffb78,(string *)in_stack_fffffffffffffb70);
    CEAngle::Deg((double *)CONCAT17(uVar1,in_stack_fffffffffffffba8));
    this_00 = (CLOptions *)&local_369;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"glat",(allocator *)this_00);
    in_stack_fffffffffffffb70 =
         (CEExecOptions *)CLOptions::AsDouble(this_00,(string *)in_stack_fffffffffffffb70);
    local_348 = in_stack_fffffffffffffb70;
    CEAngle::Deg((double *)CONCAT17(uVar1,in_stack_fffffffffffffba8));
    CESkyCoord::CESkyCoord
              ((CESkyCoord *)this_01,(CEAngle *)observer,(CEAngle *)this,
               (CESkyCoordType *)coord_type);
    CEAngle::~CEAngle((CEAngle *)0x1374ea);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator(&local_369);
    CEAngle::~CEAngle((CEAngle *)0x137511);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    CEObserver::CEObserver(this_01);
    CESkyCoord::ConvertToCIRS
              ((CESkyCoord *)CONCAT17(uVar1,in_stack_fffffffffffffba8),(CEDate *)this_01,observer);
    CEObserver::~CEObserver((CEObserver *)in_stack_fffffffffffffb70);
    PrintResults(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_2b9._97_4_ = 1;
    CESkyCoord::~CESkyCoord((CESkyCoord *)in_stack_fffffffffffffb70);
    CESkyCoord::~CESkyCoord((CESkyCoord *)in_stack_fffffffffffffb70);
    CEDate::~CEDate((CEDate *)0x1375b9);
  }
  CEExecOptions::~CEExecOptions(in_stack_fffffffffffffb70);
  return 0;
}

Assistant:

int main(int argc, char** argv) 
{
    // Get the options from the command line
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0 ;
    
    // Convert the coordinates
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);
    CESkyCoord gal_coord(CEAngle::Deg(opts.AsDouble("glon")),
                         CEAngle::Deg(opts.AsDouble("glat")),
                         CESkyCoordType::GALACTIC);
    CESkyCoord cirs_coord = gal_coord.ConvertToCIRS(date);
    
    // Print the results
    PrintResults(opts, cirs_coord) ;
    
    return 0 ;
}